

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int execSql(sqlite3 *db,char **pzErrMsg,char *zSql)

{
  int iVar1;
  char *zFormat;
  sqlite3_stmt *pStmt;
  sqlite3_stmt *local_20;
  
  if (zSql == (char *)0x0) {
    return 7;
  }
  iVar1 = sqlite3LockAndPrepare(db,zSql,-1,0,(Vdbe *)0x0,&local_20,(char **)0x0);
  if (iVar1 != 0) {
    zFormat = sqlite3_errmsg(db);
    sqlite3SetString(pzErrMsg,db,zFormat);
    iVar1 = sqlite3_errcode(db);
    return iVar1;
  }
  sqlite3_step(local_20);
  iVar1 = vacuumFinalize(db,local_20,pzErrMsg);
  return iVar1;
}

Assistant:

static int execSql(sqlite3 *db, char **pzErrMsg, const char *zSql){
  sqlite3_stmt *pStmt;
  VVA_ONLY( int rc; )
  if( !zSql ){
    return SQLITE_NOMEM;
  }
  if( SQLITE_OK!=sqlite3_prepare(db, zSql, -1, &pStmt, 0) ){
    sqlite3SetString(pzErrMsg, db, sqlite3_errmsg(db));
    return sqlite3_errcode(db);
  }
  VVA_ONLY( rc = ) sqlite3_step(pStmt);
  assert( rc!=SQLITE_ROW || (db->flags&SQLITE_CountRows) );
  return vacuumFinalize(db, pStmt, pzErrMsg);
}